

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_Interval::Includes(ON_Interval *this,double t,bool bTestOpenInterval)

{
  uint uVar1;
  bool local_1a;
  int i;
  bool rc;
  bool bTestOpenInterval_local;
  double t_local;
  ON_Interval *this_local;
  
  local_1a = false;
  if ((((-1.23432101234321e+308 < t) && (t < 1.23432101234321e+308)) &&
      (-1.23432101234321e+308 < this->m_t[0])) &&
     (((this->m_t[0] <= 1.23432101234321e+308 && this->m_t[0] != 1.23432101234321e+308 &&
       (-1.23432101234321e+308 < this->m_t[1])) &&
      (this->m_t[1] <= 1.23432101234321e+308 && this->m_t[1] != 1.23432101234321e+308)))) {
    uVar1 = (uint)(this->m_t[1] < this->m_t[0]);
    if (bTestOpenInterval) {
      local_1a = false;
      if (this->m_t[(int)uVar1] < t) {
        local_1a = t < this->m_t[(int)(1 - uVar1)];
      }
    }
    else {
      local_1a = false;
      if (this->m_t[(int)uVar1] <= t) {
        local_1a = t <= this->m_t[(int)(1 - uVar1)];
      }
    }
  }
  return local_1a;
}

Assistant:

bool
ON_Interval::Includes( double t, bool bTestOpenInterval) const
{
  bool rc = false;
  if ( ON_IS_VALID(t) && ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]) )
  {
    int i = (m_t[0] <= m_t[1]) ? 0 : 1;
    if ( bTestOpenInterval )
    {
      rc = ( m_t[i] < t && t < m_t[1-i] ) ? true : false;
    }
    else
    {
      rc = ( m_t[i] <= t && t <= m_t[1-i] ) ? true : false;
    }
  }
  return rc;
}